

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall psy::C::SyntaxDumper::visitIfStatement(SyntaxDumper *this,IfStatementSyntax *node)

{
  ExpressionSyntax *pEVar1;
  StatementSyntax *pSVar2;
  SyntaxToken local_108;
  SyntaxToken local_d0;
  SyntaxToken local_98;
  SyntaxToken local_50;
  IfStatementSyntax *local_18;
  IfStatementSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (IfStatementSyntax *)this;
  IfStatementSyntax::ifKeyword(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  IfStatementSyntax::openParenthesisToken(&local_98,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_98,local_18);
  SyntaxToken::~SyntaxToken(&local_98);
  pEVar1 = IfStatementSyntax::condition(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  IfStatementSyntax::closeParenthesisToken(&local_d0,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_d0,local_18);
  SyntaxToken::~SyntaxToken(&local_d0);
  pSVar2 = IfStatementSyntax::statement(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pSVar2);
  IfStatementSyntax::elseKeyword(&local_108,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_108,local_18);
  SyntaxToken::~SyntaxToken(&local_108);
  pSVar2 = IfStatementSyntax::elseStatement(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pSVar2);
  return Skip;
}

Assistant:

virtual Action visitIfStatement(const IfStatementSyntax* node) override
    {
        terminal(node->ifKeyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->condition());
        terminal(node->closeParenthesisToken(), node);
        nonterminal(node->statement());
        terminal(node->elseKeyword(), node);
        nonterminal(node->elseStatement());
        return Action::Skip;
    }